

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcMove::IfcMove(IfcMove *this)

{
  IfcMove *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d0,"IfcMove");
  IfcTask::IfcTask(&this->super_IfcTask,&PTR_construction_vtable_24__00ff6d78);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMove,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMove,_3UL> *)
             &(this->super_IfcTask).field_0x190,&PTR_construction_vtable_24__00ff6e68);
  *(undefined8 *)&this->super_IfcTask = 0xff6c70;
  *(undefined8 *)&this->field_0x1d0 = 0xff6d60;
  *(undefined8 *)&(this->super_IfcTask).field_0x88 = 0xff6c98;
  *(undefined8 *)&(this->super_IfcTask).field_0x98 = 0xff6cc0;
  *(undefined8 *)&(this->super_IfcTask).field_0xd0 = 0xff6ce8;
  (this->super_IfcTask).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>._vptr_ObjectHelper
       = (_func_int **)0xff6d10;
  *(undefined8 *)&(this->super_IfcTask).field_0x190 = 0xff6d38;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement> *)
             &(this->super_IfcTask).field_0x1a0,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>::Lazy
            (&this->MoveTo,(LazyObject *)0x0);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_1UL,_0UL>_>
  ::Maybe(&this->PunchList);
  return;
}

Assistant:

IfcMove() : Object("IfcMove") {}